

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsdl-attr.cpp
# Opt level: O2

bool __thiscall yactfr::internal::TsdlAttr::boolEquiv(TsdlAttr *this)

{
  string *__lhs;
  string msg;
  bool bVar1;
  ostream *poVar2;
  ostringstream ss;
  undefined8 in_stack_fffffffffffffe30;
  TextLocation in_stack_fffffffffffffe38;
  TextLocation local_1a8;
  ostringstream local_190 [376];
  
  if (this->kind == Ident) {
    __lhs = &this->strVal;
    bVar1 = std::operator==(__lhs,"true");
    if (bVar1) {
      return true;
    }
    bVar1 = std::operator==(__lhs,"TRUE");
    if (bVar1) {
      return true;
    }
    bVar1 = std::operator==(__lhs,"false");
    if ((bVar1) || (bVar1 = std::operator==(__lhs,"FALSE"), bVar1)) {
      return false;
    }
  }
  else if (this->kind == UInt) {
    if (this->uintVal == 1) {
      return true;
    }
    if (this->uintVal == 0) {
      return false;
    }
  }
  std::__cxx11::ostringstream::ostringstream(local_190);
  poVar2 = std::operator<<((ostream *)local_190,
                           "Expecting `0`, `false`, `FALSE`, `1`, `true`, or `TRUE` for `");
  poVar2 = std::operator<<(poVar2,(string *)&this->name);
  std::operator<<(poVar2,"` attribute.");
  std::__cxx11::stringbuf::str();
  valTextLoc(&local_1a8,this);
  msg._M_string_length = local_1a8._lineNumber;
  msg._M_dataplus._M_p = (pointer)local_1a8._offset;
  msg.field_2._M_allocated_capacity = local_1a8._colNumber;
  msg.field_2._8_8_ = in_stack_fffffffffffffe30;
  throwTextParseError(msg,in_stack_fffffffffffffe38);
}

Assistant:

bool TsdlAttr::boolEquiv() const
{
    switch (kind) {
    case Kind::UInt:
        if (uintVal == 1) {
            return true;
        } else if (uintVal == 0) {
            return false;
        }
        break;

    case Kind::Ident:
        if (strVal == "true" || strVal == "TRUE") {
            return true;
        } else if (strVal == "false" || strVal == "FALSE") {
            return false;
        }

    default:
        break;
    }

    std::ostringstream ss;

    ss << "Expecting `0`, `false`, `FALSE`, `1`, `true`, or `TRUE` for `" <<
          name << "` attribute.";
    throwTextParseError(ss.str(), this->valTextLoc());
}